

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<kj::File,_std::nullptr_t> __thiscall kj::newMemfdFile(kj *this,uint flags)

{
  int iVar1;
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar2;
  Fault f;
  OwnFd local_44;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  do {
    local_44.fd = memfd_create("kj-memfd",flags | 1);
    if (-1 < local_44.fd) goto LAB_001ed868;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_40.exception = (Exception *)0x0;
    local_38 = 0;
    uStack_30 = 0;
    _::Debug::Fault::init
              (&local_40,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
              );
    _::Debug::Fault::fatal(&local_40);
  }
LAB_001ed868:
  newDiskFile(this,&local_44);
  OwnFd::~OwnFd(&local_44);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<File> newMemfdFile(uint flags) {
  return newDiskFile(KJ_SYSCALL_FD(memfd_create("kj-memfd", flags | MFD_CLOEXEC)));
}